

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEFilter<unsigned_char>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t *sel_count,TableFilter *filter,
               TableFilterState *filter_state)

{
  data_t dVar1;
  char cVar2;
  uint uVar3;
  _func_int *p_Var4;
  data_ptr_t pdVar5;
  pointer pSVar6;
  _func_int **pp_Var7;
  long lVar8;
  ulong uVar9;
  InternalException *this;
  _func_int **pp_Var10;
  _func_int **pp_Var11;
  ulong uVar12;
  _func_int **pp_Var13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  idx_t iVar17;
  _func_int *dataptr;
  SelectionVector matching_sel;
  SelectionVector run_matches;
  Vector run_vector;
  undefined1 local_110 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  SelectionVector local_c8;
  LogicalType local_b0;
  Vector local_98;
  
  pSVar6 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar6 + 3));
  p_Var4 = pSVar6[3]._vptr_SegmentScanState[2];
  iVar17 = segment->offset;
  dataptr = p_Var4 + iVar17 + 8;
  uVar3 = *(uint *)&pSVar6[6]._vptr_SegmentScanState;
  if (pSVar6[7]._vptr_SegmentScanState == (_func_int **)0x0) {
    pp_Var10 = (_func_int **)((ulong)uVar3 - 8);
    pp_Var7 = (_func_int **)operator_new__((ulong)pp_Var10);
    pSVar6[7]._vptr_SegmentScanState = pp_Var7;
    switchD_005681f0::default(pp_Var7,0,(size_t)pp_Var10);
    LogicalType::LogicalType(&local_b0,&result->type);
    Vector::Vector(&local_98,&local_b0,(data_ptr_t)dataptr);
    LogicalType::~LogicalType(&local_b0);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_110);
    Vector::ToUnifiedFormat(&local_98,(idx_t)pp_Var10,(UnifiedVectorFormat *)local_110);
    local_c8.sel_vector = (sel_t *)0x0;
    local_c8.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_c8.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pSVar6[8]._vptr_SegmentScanState = pp_Var10;
    ColumnSegment::FilterSelection
              (&local_c8,&local_98,(UnifiedVectorFormat *)local_110,filter,filter_state,
               (idx_t)pp_Var10,(idx_t *)(pSVar6 + 8));
    pp_Var10 = pSVar6[8]._vptr_SegmentScanState;
    if (pp_Var10 != (_func_int **)0x0) {
      pp_Var7 = pSVar6[7]._vptr_SegmentScanState;
      pp_Var11 = (_func_int **)0x0;
      do {
        pp_Var13 = pp_Var11;
        if (local_c8.sel_vector != (sel_t *)0x0) {
          pp_Var13 = (_func_int **)(ulong)local_c8.sel_vector[(long)pp_Var11];
        }
        *(undefined1 *)((long)pp_Var7 + (long)pp_Var13) = 1;
        pp_Var11 = (_func_int **)((long)pp_Var11 + 1);
      } while (pp_Var10 != pp_Var11);
    }
    if (local_c8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
    }
    if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
    }
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)((long)&local_98 + 8));
  }
  if (pSVar6[8]._vptr_SegmentScanState == (_func_int **)0x0) {
    *sel_count = 0;
  }
  else {
    lVar8 = iVar17 + uVar3;
    pdVar5 = result->data;
    Vector::SetVectorType(result,FLAT_VECTOR);
    SelectionVector::SelectionVector((SelectionVector *)local_110,*sel_count);
    uVar16 = *sel_count;
    if (sel->sel_vector == (sel_t *)0x0) {
      if (uVar16 != 0) {
        pp_Var10 = pSVar6[4]._vptr_SegmentScanState;
        pp_Var7 = pSVar6[5]._vptr_SegmentScanState;
        iVar17 = 0;
        uVar14 = 0;
LAB_0058633f:
        uVar9 = (long)(ulong)*(ushort *)(p_Var4 + (long)pp_Var10 * 2 + lVar8) - (long)pp_Var7;
        uVar12 = uVar16 - uVar14;
        dVar1 = (data_t)dataptr[(long)pp_Var10];
        cVar2 = *(char *)((long)pSVar6[7]._vptr_SegmentScanState + (long)pp_Var10);
        if (uVar9 <= uVar12) goto code_r0x00586365;
        if ((uVar16 != uVar14) && (cVar2 != '\0')) {
          do {
            pdVar5[uVar14] = dVar1;
            *(sel_t *)((long)(sel_t **)local_110._0_8_ + iVar17 * 4) = (sel_t)uVar14;
            iVar17 = iVar17 + 1;
            uVar14 = uVar14 + 1;
          } while (uVar16 != uVar14);
          pp_Var7 = pSVar6[5]._vptr_SegmentScanState;
        }
        pSVar6[5]._vptr_SegmentScanState = (_func_int **)((long)pp_Var7 + uVar12);
        goto LAB_005863ff;
      }
      iVar17 = 0;
    }
    else {
      if (uVar16 == 0) {
        iVar17 = 0;
        uVar16 = 0;
      }
      else {
        uVar9 = 0;
        iVar17 = 0;
        uVar14 = 0;
        do {
          uVar16 = uVar9;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)sel->sel_vector[uVar9];
          }
          uVar12 = uVar16 - uVar14;
          if (uVar16 < uVar14) {
            this = (InternalException *)__cxa_allocate_exception(0x10);
            local_98._0_8_ = &local_98.type.type_info_;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,
                       "Error in RLEFilter - selection vector indices are not ordered","");
            InternalException::InternalException(this,(string *)&local_98);
            __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pp_Var10 = pSVar6[4]._vptr_SegmentScanState;
          if (uVar12 != 0) {
            pp_Var7 = pSVar6[5]._vptr_SegmentScanState;
            do {
              uVar14 = (long)(ulong)*(ushort *)(p_Var4 + (long)pp_Var10 * 2 + lVar8) - (long)pp_Var7
              ;
              if (uVar12 < uVar14) {
                uVar14 = uVar12;
              }
              pp_Var7 = (_func_int **)((long)pp_Var7 + uVar14);
              if ((_func_int **)(ulong)*(ushort *)(p_Var4 + (long)pp_Var10 * 2 + lVar8) <= pp_Var7)
              {
                pp_Var10 = (_func_int **)((long)pp_Var10 + 1);
                pSVar6[4]._vptr_SegmentScanState = pp_Var10;
                pp_Var7 = (_func_int **)0x0;
              }
              uVar12 = uVar12 - uVar14;
            } while (uVar12 != 0);
            pSVar6[5]._vptr_SegmentScanState = pp_Var7;
          }
          if (*(char *)((long)pSVar6[7]._vptr_SegmentScanState + (long)pp_Var10) == '\x01') {
            pdVar5[uVar16] = (data_t)dataptr[(long)pp_Var10];
            *(sel_t *)((long)(sel_t **)local_110._0_8_ + iVar17 * 4) = (sel_t)uVar16;
            iVar17 = iVar17 + 1;
          }
          uVar9 = uVar9 + 1;
          uVar14 = uVar16;
        } while (uVar9 < *sel_count);
      }
      uVar16 = vector_count - uVar16;
      if (uVar16 != 0) {
        pp_Var10 = pSVar6[4]._vptr_SegmentScanState;
        pp_Var7 = pSVar6[5]._vptr_SegmentScanState;
        do {
          uVar14 = (long)(ulong)*(ushort *)(p_Var4 + (long)pp_Var10 * 2 + lVar8) - (long)pp_Var7;
          if (uVar16 < uVar14) {
            uVar14 = uVar16;
          }
          pp_Var7 = (_func_int **)((long)pp_Var7 + uVar14);
          if ((_func_int **)(ulong)*(ushort *)(p_Var4 + (long)pp_Var10 * 2 + lVar8) <= pp_Var7) {
            pp_Var10 = (_func_int **)((long)pp_Var10 + 1);
            pSVar6[4]._vptr_SegmentScanState = pp_Var10;
            pp_Var7 = (_func_int **)0x0;
          }
          uVar16 = uVar16 - uVar14;
        } while (uVar16 != 0);
        pSVar6[5]._vptr_SegmentScanState = pp_Var7;
      }
    }
LAB_005863ff:
    if (iVar17 != *sel_count) {
      shared_ptr<duckdb::SelectionData,_true>::operator=
                (&sel->selection_data,(shared_ptr<duckdb::SelectionData,_true> *)(local_110 + 8));
      sel->sel_vector = (sel_t *)local_110._0_8_;
      *sel_count = iVar17;
    }
    if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100._M_pi);
    }
  }
  return;
code_r0x00586365:
  if (((_func_int **)(ulong)*(ushort *)(p_Var4 + (long)pp_Var10 * 2 + lVar8) != pp_Var7) &&
     (uVar12 = uVar14, uVar15 = uVar9, cVar2 != '\0')) {
    do {
      pdVar5[uVar12] = dVar1;
      *(sel_t *)((long)(sel_t **)local_110._0_8_ + iVar17 * 4) = (sel_t)uVar12;
      iVar17 = iVar17 + 1;
      uVar15 = uVar15 - 1;
      uVar12 = uVar12 + 1;
    } while (uVar15 != 0);
    pp_Var10 = pSVar6[4]._vptr_SegmentScanState;
  }
  uVar14 = uVar14 + uVar9;
  pp_Var10 = (_func_int **)((long)pp_Var10 + 1);
  pSVar6[4]._vptr_SegmentScanState = pp_Var10;
  pSVar6[5]._vptr_SegmentScanState = (_func_int **)0x0;
  pp_Var7 = (_func_int **)0x0;
  if (uVar16 <= uVar14) goto LAB_005863ff;
  goto LAB_0058633f;
}

Assistant:

void RLEFilter(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result, SelectionVector &sel,
               idx_t &sel_count, const TableFilter &filter, TableFilterState &filter_state) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	auto total_run_count = (scan_state.rle_count_offset - RLEConstants::RLE_HEADER_SIZE) / sizeof(T);
	if (!scan_state.matching_runs) {
		// we haven't applied the filter yet
		// apply the filter to all RLE values at once

		// initialize the filter set to all false (all runs are filtered out)
		scan_state.matching_runs = make_unsafe_uniq_array<bool>(total_run_count);
		memset(scan_state.matching_runs.get(), 0, sizeof(bool) * total_run_count);

		// execute the filter over all runs at once
		Vector run_vector(result.GetType(), data_ptr_cast(data_pointer));

		UnifiedVectorFormat run_format;
		run_vector.ToUnifiedFormat(total_run_count, run_format);

		SelectionVector run_matches;
		scan_state.matching_run_count = total_run_count;
		ColumnSegment::FilterSelection(run_matches, run_vector, run_format, filter, filter_state, total_run_count,
		                               scan_state.matching_run_count);

		// for any runs that pass the filter - set the matches to true
		for (idx_t i = 0; i < scan_state.matching_run_count; i++) {
			auto idx = run_matches.get_index(i);
			scan_state.matching_runs[idx] = true;
		}
	}
	if (scan_state.matching_run_count == 0) {
		// early-out, no runs match the filter so the filter can never pass
		sel_count = 0;
		return;
	}
	// scan (the subset of) the matching runs AND set the output selection vector with the rows that match
	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t matching_count = 0;
	SelectionVector matching_sel(sel_count);
	if (!sel.IsSet()) {
		// no selection vector yet - fast path
		// this is essentially the normal scan, but we apply the filter and fill the selection vector
		idx_t result_offset = 0;
		idx_t result_end = sel_count;
		while (result_offset < result_end) {
			rle_count_t run_end = index_pointer[scan_state.entry_pos];
			idx_t run_count = run_end - scan_state.position_in_entry;
			idx_t remaining_scan_count = result_end - result_offset;
			// the run is scanned - scan it
			T element = data_pointer[scan_state.entry_pos];
			if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
				if (scan_state.matching_runs[scan_state.entry_pos]) {
					for (idx_t i = 0; i < remaining_scan_count; i++) {
						result_data[result_offset + i] = element;
						matching_sel.set_index(matching_count++, result_offset + i);
					}
				}
				scan_state.position_in_entry += remaining_scan_count;
				break;
			}

			if (scan_state.matching_runs[scan_state.entry_pos]) {
				for (idx_t i = 0; i < run_count; i++) {
					result_data[result_offset + i] = element;
					matching_sel.set_index(matching_count++, result_offset + i);
				}
			}

			result_offset += run_count;
			scan_state.ForwardToNextRun();
		}
	} else {
		// we already have a selection applied - this is more complex since we need to merge it with our filter
		// use a simpler (but slower) approach
		idx_t prev_idx = 0;
		for (idx_t i = 0; i < sel_count; i++) {
			auto read_idx = sel.get_index(i);
			if (read_idx < prev_idx) {
				throw InternalException("Error in RLEFilter - selection vector indices are not ordered");
			}
			// skip forward to the next index
			scan_state.SkipInternal(index_pointer, read_idx - prev_idx);
			prev_idx = read_idx;
			if (!scan_state.matching_runs[scan_state.entry_pos]) {
				// this run is filtered out - we don't need to scan it
				continue;
			}
			// the run is not filtered out - read the element
			result_data[read_idx] = data_pointer[scan_state.entry_pos];
			matching_sel.set_index(matching_count++, read_idx);
		}
		// skip the tail
		scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
	}

	// set up the filter result
	if (matching_count != sel_count) {
		sel.Initialize(matching_sel);
		sel_count = matching_count;
	}
}